

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

string * __thiscall
stackjit::TypeSystem::toString_abi_cxx11_
          (string *__return_storage_ptr__,TypeSystem *this,PrimitiveTypes primitiveType)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Void";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "Int";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "Float";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "Bool";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "Char";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeSystem::toString(PrimitiveTypes primitiveType) {
		switch (primitiveType) {
			case PrimitiveTypes::Void:
				return "Void";
			case PrimitiveTypes::Integer:
				return "Int";
			case PrimitiveTypes::Float:
				return "Float";
			case PrimitiveTypes::Bool:
				return "Bool";
			case PrimitiveTypes::Char:
				return "Char";
		}

		return "";
	}